

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

int __thiscall
CTPNSymDebugLocal::gen_code_asi
          (CTPNSymDebugLocal *this,int discard,int phase,tc_asitype_t typ,char *param_4,
          CTcPrsNode *rhs,int param_6,int param_7,void **param_8)

{
  uint uVar1;
  CTcGenTarg *pCVar2;
  uint16_t tmp;
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  size_t __n;
  int iVar3;
  char buf_2 [2];
  char buf_3 [2];
  char buf [2];
  char buf_1 [2];
  undefined8 local_28;
  
  __n = CONCAT71((int7)(CONCAT44(in_register_0000000c,typ) >> 8),phase != 2);
  if (phase != 2 && typ != TC_ASI_SIMPLE) {
    iVar3 = 0;
    if (phase == 1) {
      iVar3 = 0;
      (**(this->super_CTPNSymDebugLocalBase).super_CTcPrsNode.super_CTcPrsNodeBase.
         _vptr_CTcPrsNodeBase)(this,0,0);
    }
  }
  else {
    local_28 = in_RAX;
    if (rhs != (CTcPrsNode *)0x0) {
      (**(rhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(rhs,0,0);
    }
    if (discard == 0) {
      CTcGenTarg::write_op(G_cg,0x88);
      pCVar2 = G_cg;
      iVar3 = G_cg->sp_depth_;
      uVar1 = iVar3 + 1;
      __n = (size_t)uVar1;
      G_cg->sp_depth_ = uVar1;
      if (pCVar2->max_sp_depth_ <= iVar3) {
        pCVar2->max_sp_depth_ = uVar1;
      }
    }
    if ((this->super_CTPNSymDebugLocalBase).ctx_arr_idx_ == 0) {
      CTcGenTarg::write_op(G_cg,((this->super_CTPNSymDebugLocalBase).field_0x14 & 1) - 0x17);
      local_28 = CONCAT62(local_28._2_6_,(short)(this->super_CTPNSymDebugLocalBase).var_id_);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_28,(void *)0x2,__n);
      local_28._0_4_ =
           CONCAT22((short)(this->super_CTPNSymDebugLocalBase).frame_idx_,(undefined2)local_28);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_28 + 2,(void *)0x2,__n);
    }
    else {
      CTcGenTarg::write_op(G_cg,0x85);
      local_28._0_6_ =
           CONCAT24((short)(this->super_CTPNSymDebugLocalBase).var_id_,(undefined4)local_28);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_28 + 4,(void *)0x2,__n);
      local_28 = CONCAT26((short)(this->super_CTPNSymDebugLocalBase).frame_idx_,(undefined6)local_28
                         );
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_28 + 6,(void *)0x2,__n);
      CTPNConst::s_gen_code_int((long)(this->super_CTPNSymDebugLocalBase).ctx_arr_idx_);
      CTcGenTarg::write_op(G_cg,0xe4);
      CTcGenTarg::write_op(G_cg,0x89);
      G_cg->sp_depth_ = G_cg->sp_depth_ + -3;
    }
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int CTPNSymDebugLocal::gen_code_asi(int discard, int phase,
                                    tc_asitype_t typ, const char *,
                                    CTcPrsNode *rhs,
                                    int, int, void **)
{
    /* check what we're doing */
    if (typ == TC_ASI_SIMPLE || phase == 2)
    {        
        /* 
         *   Simple assignment, or phase 2 of a compound assignment.  In
         *   either case, just assign the rvalue to the variable.  
         */
        if (rhs != 0)
            rhs->gen_code(FALSE, FALSE);

        /* 
         *   if we're not discarding the result, duplicate the value so we'll
         *   have a copy after the assignment 
         */
        if (!discard)
        {
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
        }
        
        /* check for a context property */
        if (ctx_arr_idx_ == 0)
        {
            /* 
             *   generate the debug-local-set instruction - the operands are
             *   the variable number and the stack frame index 
             */
            G_cg->write_op(is_param_ ? OPC_SETDBARG : OPC_SETDBLCL);
            G_cs->write2(var_id_);
            G_cs->write2(frame_idx_);
        }
        else
        {
            /* get the local containing our context object */
            G_cg->write_op(OPC_GETDBLCL);
            G_cs->write2(var_id_);
            G_cs->write2(frame_idx_);
            
            /* set the actual variable value in the context object */
            CTPNConst::s_gen_code_int(ctx_arr_idx_);
            G_cg->write_op(OPC_SETIND);
            G_cg->write_op(OPC_DISC);
            
            /* 
             *   we did three pops (SETIND), then a push (SETIND), then a pop
             *   (DISC) - this is a net of three extra pops 
             */
            G_cg->note_pop(3);
        }
        
        /* the debug-local-set removes the rvalue from the stack */
        G_cg->note_pop();
        
        /* handled */
        return TRUE;
    }
    else if (phase == 1)
    {
        /* 
         *   Compound assignment, phase 1.  Simply generate our value and let
         *   the caller proceed with the generic combination operator. 
         */
        gen_code(FALSE, FALSE);
        return FALSE;
    }
    else
    {
        /* ignore other phases */
        return FALSE;
    }
}